

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O0

int dwarf_get_rnglists_entry_fields_a
              (Dwarf_Rnglists_Head head,Dwarf_Unsigned entrynum,uint *entrylen,uint *rle_value_out,
              Dwarf_Unsigned *raw1,Dwarf_Unsigned *raw2,Dwarf_Bool *debug_addr_unavailable,
              Dwarf_Unsigned *cooked1,Dwarf_Unsigned *cooked2,Dwarf_Error *error)

{
  Dwarf_Rnglists_Entry_conflict pDVar1;
  Dwarf_Rnglists_Entry_conflict e;
  Dwarf_Unsigned *raw2_local;
  Dwarf_Unsigned *raw1_local;
  uint *rle_value_out_local;
  uint *entrylen_local;
  Dwarf_Unsigned entrynum_local;
  Dwarf_Rnglists_Head head_local;
  
  if (((head == (Dwarf_Rnglists_Head)0x0) || (head->rh_dbg == (Dwarf_Debug)0x0)) ||
     (head->rh_magic != 0xabcd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL NULL or invalid Dwarf_Rnglists_Head argument passed to dwarf_get_rnglists_entry_fields_a()"
                       );
    head_local._4_4_ = 1;
  }
  else if (entrynum < head->rh_count) {
    pDVar1 = head->rh_rnglists[entrynum];
    if (entrylen != (uint *)0x0) {
      *entrylen = pDVar1->rle_entrylen;
    }
    if (rle_value_out != (uint *)0x0) {
      *rle_value_out = pDVar1->rle_code;
    }
    if (raw1 != (Dwarf_Unsigned *)0x0) {
      *raw1 = pDVar1->rle_raw1;
    }
    if (raw2 != (Dwarf_Unsigned *)0x0) {
      *raw2 = pDVar1->rle_raw2;
    }
    if (debug_addr_unavailable != (Dwarf_Bool *)0x0) {
      *debug_addr_unavailable = pDVar1->rle_index_failed;
    }
    if (cooked1 != (Dwarf_Unsigned *)0x0) {
      *cooked1 = pDVar1->rle_cooked1;
    }
    if (cooked2 != (Dwarf_Unsigned *)0x0) {
      *cooked2 = pDVar1->rle_cooked2;
    }
    head_local._4_4_ = 0;
  }
  else {
    head_local._4_4_ = -1;
  }
  return head_local._4_4_;
}

Assistant:

int
dwarf_get_rnglists_entry_fields_a(
    Dwarf_Rnglists_Head head,
    Dwarf_Unsigned  entrynum,
    unsigned       *entrylen,
    unsigned       *rle_value_out,
    Dwarf_Unsigned *raw1,
    Dwarf_Unsigned *raw2,
    Dwarf_Bool     *debug_addr_unavailable,
    Dwarf_Unsigned *cooked1,
    Dwarf_Unsigned *cooked2,
    Dwarf_Error *error)
{
    Dwarf_Rnglists_Entry e = 0;

    if (!head || !head->rh_dbg || head->rh_magic != RNGLISTS_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL "
            "NULL or invalid Dwarf_Rnglists_Head "
            "argument passed to "
            "dwarf_get_rnglists_entry_fields_a()");
        return DW_DLV_ERROR;
    }
    if (entrynum >= head->rh_count) {
        return DW_DLV_NO_ENTRY;
    }
    e = head->rh_rnglists[entrynum];
    if (entrylen) {
        *entrylen  = e->rle_entrylen;
    }
    if (rle_value_out) {
        *rle_value_out = e->rle_code;
    }
    if (raw1) {
        *raw1      = e->rle_raw1;
    }
    if (raw2) {
        *raw2      = e->rle_raw2;
    }
    if (debug_addr_unavailable) {
        *debug_addr_unavailable = e->rle_index_failed;
    }
    if (cooked1) {
        *cooked1   = e->rle_cooked1;
    }
    if (cooked2) {
        *cooked2   = e->rle_cooked2;
    }
    return DW_DLV_OK;
}